

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::emit_continue_block_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t continue_block,
          bool follow_true_block,bool follow_false_block)

{
  uint32_t uVar1;
  byte *pbVar2;
  CompilerError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__end1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__begin1;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *__range1;
  BlockID local_168;
  uint32_t local_164;
  BlockID local_160;
  uint32_t local_15c;
  BlockID local_158 [4];
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *local_148;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *old;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  statements;
  SPIRBlock *block;
  bool follow_false_block_local;
  bool follow_true_block_local;
  uint32_t continue_block_local;
  CompilerGLSL *this_local;
  
  statements.stack_storage.aligned_char._248_8_ =
       Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,continue_block);
  this->current_continue_block = (SPIRBlock *)statements.stack_storage.aligned_char._248_8_;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)&old);
  local_148 = this->redirect_statement;
  this->redirect_statement =
       (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        *)&old;
  while( true ) {
    while( true ) {
      while( true ) {
        uVar1 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)(statements.stack_storage.aligned_char._248_8_ + 8));
        pbVar2 = VectorView<unsigned_char>::operator[]
                           (&(this->super_Compiler).ir.block_meta.super_VectorView<unsigned_char>,
                            (ulong)uVar1);
        if ((*pbVar2 & 1) != 0) {
          this->redirect_statement = local_148;
          __end1 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::begin((VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&old);
          pbVar3 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::end((VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&old);
          for (; __end1 != pbVar3; __end1 = __end1 + 1) {
            uVar4 = ::std::__cxx11::string::empty();
            if (((uVar4 & 1) == 0) &&
               (pcVar5 = (char *)::std::__cxx11::string::back(), *pcVar5 == ';')) {
              lVar6 = ::std::__cxx11::string::size();
              ::std::__cxx11::string::erase((ulong)__end1,lVar6 - 1);
            }
          }
          this->current_continue_block = (SPIRBlock *)0x0;
          merge(__return_storage_ptr__,
                (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)&old,", ");
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                          *)&old);
          return __return_storage_ptr__;
        }
        emit_block_instructions(this,(SPIRBlock *)statements.stack_storage.aligned_char._248_8_);
        uVar1 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)(statements.stack_storage.aligned_char._248_8_ + 0x18));
        if (uVar1 == 0) break;
        TypedID<(spirv_cross::Types)6>::TypedID(local_158,continue_block);
        local_15c = *(uint32_t *)(statements.stack_storage.aligned_char._248_8_ + 0x18);
        flush_phi(this,local_158[0],(BlockID)local_15c);
        uVar1 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)(statements.stack_storage.aligned_char._248_8_ + 0x18));
        statements.stack_storage.aligned_char._248_8_ =
             Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar1);
      }
      uVar1 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)(statements.stack_storage.aligned_char._248_8_ + 0x2c));
      if ((uVar1 == 0) || (!follow_true_block)) break;
      TypedID<(spirv_cross::Types)6>::TypedID(&local_160,continue_block);
      local_164 = *(uint32_t *)(statements.stack_storage.aligned_char._248_8_ + 0x2c);
      flush_phi(this,local_160,(BlockID)local_164);
      uVar1 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)(statements.stack_storage.aligned_char._248_8_ + 0x2c));
      statements.stack_storage.aligned_char._248_8_ =
           Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar1);
    }
    uVar1 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)(statements.stack_storage.aligned_char._248_8_ + 0x30));
    if ((uVar1 == 0) || (!follow_false_block)) break;
    TypedID<(spirv_cross::Types)6>::TypedID(&local_168,continue_block);
    flush_phi(this,local_168,
              (BlockID)*(uint32_t *)(statements.stack_storage.aligned_char._248_8_ + 0x30));
    uVar1 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)(statements.stack_storage.aligned_char._248_8_ + 0x30));
    statements.stack_storage.aligned_char._248_8_ =
         Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar1);
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError(this_00,"Invalid continue block detected!");
  __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
}

Assistant:

string CompilerGLSL::emit_continue_block(uint32_t continue_block, bool follow_true_block, bool follow_false_block)
{
	auto *block = &get<SPIRBlock>(continue_block);

	// While emitting the continue block, declare_temporary will check this
	// if we have to emit temporaries.
	current_continue_block = block;

	SmallVector<string> statements;

	// Capture all statements into our list.
	auto *old = redirect_statement;
	redirect_statement = &statements;

	// Stamp out all blocks one after each other.
	while ((ir.block_meta[block->self] & ParsedIR::BLOCK_META_LOOP_HEADER_BIT) == 0)
	{
		// Write out all instructions we have in this block.
		emit_block_instructions(*block);

		// For plain branchless for/while continue blocks.
		if (block->next_block)
		{
			flush_phi(continue_block, block->next_block);
			block = &get<SPIRBlock>(block->next_block);
		}
		// For do while blocks. The last block will be a select block.
		else if (block->true_block && follow_true_block)
		{
			flush_phi(continue_block, block->true_block);
			block = &get<SPIRBlock>(block->true_block);
		}
		else if (block->false_block && follow_false_block)
		{
			flush_phi(continue_block, block->false_block);
			block = &get<SPIRBlock>(block->false_block);
		}
		else
		{
			SPIRV_CROSS_THROW("Invalid continue block detected!");
		}
	}

	// Restore old pointer.
	redirect_statement = old;

	// Somewhat ugly, strip off the last ';' since we use ',' instead.
	// Ideally, we should select this behavior in statement().
	for (auto &s : statements)
	{
		if (!s.empty() && s.back() == ';')
			s.erase(s.size() - 1, 1);
	}

	current_continue_block = nullptr;
	return merge(statements);
}